

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  IROp1 IVar1;
  IRRef1 IVar2;
  IRIns *pIVar3;
  ushort uVar4;
  TRef TVar5;
  ulong uVar6;
  IRIns *pIVar7;
  IRIns *pIVar8;
  IROp1 IVar9;
  
  if ((J->flags >> 0x10 & 1) != 0) {
    IVar1 = (J->fold).left[0].field_1.o;
    if (IVar1 == 'V') {
      pIVar3 = (J->cur).ir;
      uVar6 = (ulong)(J->fold).left[0].field_0.op1;
      if ((*(char *)((long)pIVar3 + uVar6 * 8 + 5) == 'U') &&
         (*(short *)((long)pIVar3 + uVar6 * 8 + 2) == 0)) {
        uVar4 = (J->fold).left[0].field_0.op2;
LAB_00127994:
        return (uint)uVar4;
      }
    }
    else if (IVar1 == 'U') {
      if ((J->fold).left[0].field_0.op2 != 0) {
        IVar2 = (J->fold).left[0].field_0.prev;
        (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
        (J->fold).ins.field_0.op2 = IVar2;
        TVar5 = lj_opt_cse(J);
        return TVar5;
      }
      TVar5 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x2c),IRT_STR);
      return TVar5;
    }
  }
  if (((J->flags >> 0x11 & 1) != 0) && (uVar4 = J->chain[0x57], uVar4 != 0)) {
    pIVar3 = (J->cur).ir;
    IVar1 = (J->fold).left[0].field_1.o;
    do {
      if (IVar1 == *(IROp1 *)((long)pIVar3 + (ulong)pIVar3[uVar4].field_0.op1 * 8 + 5)) {
        pIVar7 = pIVar3 + pIVar3[uVar4].field_0.op1;
        pIVar8 = (J->fold).left;
        IVar9 = IVar1;
        do {
          IVar2 = (pIVar8->field_0).op2;
          if (IVar2 != (pIVar7->field_0).op2) break;
          if (IVar9 == 'U' && IVar2 == 0) goto LAB_00127994;
          if (IVar9 == 'a' && IVar2 == 0x17) break;
          pIVar8 = pIVar3 + (pIVar8->field_0).op1;
          pIVar7 = pIVar3 + (pIVar7->field_0).op1;
          IVar9 = (pIVar8->field_1).o;
        } while (IVar9 == (pIVar7->field_1).o);
      }
      uVar4 = *(ushort *)((long)pIVar3 + (ulong)uVar4 * 8 + 6);
    } while (uVar4 != 0);
  }
  TVar5 = lj_ir_emit(J);
  return TVar5;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (fleft->op2 == IRBUFHDR_RESET)  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && irb->op2 == IRBUFHDR_RESET)
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && ira->op2 == IRBUFHDR_RESET)
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}